

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::Function<void_()>::Impl<kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>_>_>
::dispose(Own<kj::Function<void_()>::Impl<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_unix_c__:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>_>_>
          *this)

{
  Impl<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_unix_c__:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>_>
  *object;
  Impl<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_unix_c__:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>_>
  *ptrCopy;
  Own<kj::Function<void_()>::Impl<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_unix_c__:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>_>_>
  *this_local;
  
  object = this->ptr;
  if (object != (Impl<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_unix_c__:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>_>
                 *)0x0) {
    this->ptr = (Impl<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_unix_c__:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>_>
                 *)0x0;
    Disposer::
    dispose<kj::Function<void()>::Impl<kj::CaptureByMove<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::__1,kj::(anonymous_namespace)::SocketAddress::LookupParams>>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }